

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O2

int lj_tab_next(GCtab *t,cTValue *key,TValue *o)

{
  uint64_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  TValue TVar5;
  TValue *pTVar6;
  
  uVar2 = lj_tab_keyindex(t,key);
  uVar4 = (ulong)uVar2;
  do {
    if (t->asize <= uVar4) {
      uVar3 = (int)uVar4 - t->asize;
      while( true ) {
        if (t->hmask < uVar3) {
          return (int)uVar3 >> 0x1f;
        }
        uVar1 = (t->node).ptr64;
        if (*(long *)(uVar1 + (ulong)uVar3 * 0x18) != -1) break;
        uVar3 = uVar3 + 1;
      }
      pTVar6 = (TValue *)(uVar1 + (ulong)uVar3 * 0x18);
      *o = pTVar6[1];
      TVar5 = *pTVar6;
LAB_00110ebb:
      o[1] = TVar5;
      return 1;
    }
    uVar1 = (t->array).ptr64;
    if (*(long *)(uVar1 + uVar4 * 8) != -1) {
      o->n = (double)(int)uVar4;
      TVar5 = *(TValue *)(uVar1 + uVar4 * 8);
      goto LAB_00110ebb;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int lj_tab_next(GCtab *t, cTValue *key, TValue *o)
{
  uint32_t idx = lj_tab_keyindex(t, key);  /* Find successor index of key. */
  /* First traverse the array part. */
  for (; idx < t->asize; idx++) {
    cTValue *a = arrayslot(t, idx);
    if (LJ_LIKELY(!tvisnil(a))) {
      setintV(o, idx);
      o[1] = *a;
      return 1;
    }
  }
  idx -= t->asize;
  /* Then traverse the hash part. */
  for (; idx <= t->hmask; idx++) {
    Node *n = &noderef(t->node)[idx];
    if (!tvisnil(&n->val)) {
      o[0] = n->key;
      o[1] = n->val;
      return 1;
    }
  }
  return (int32_t)idx < 0 ? -1 : 0;  /* Invalid key or end of traversal. */
}